

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_additions_with_controls_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_may_combine_subscription_set_additions_with_controls_Test
           *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char cVar3;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *pvVar4;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  _Alloc_hider _Var8;
  char *pcVar9;
  char *in_R9;
  initializer_list<bidfx_public_api::price::subject::Subject> __l;
  initializer_list<bidfx_public_api::price::subject::Subject> __l_00;
  AssertionResult gtest_ar_;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set2;
  map<unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  controls;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  subjects_set1;
  SubjectSetRegister subject_register;
  AssertHelper local_258;
  AssertHelper local_250;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_238;
  undefined1 local_220 [8];
  undefined1 local_218 [16];
  undefined1 local_208 [24];
  Subject local_1f0 [24];
  Subject local_1d8 [24];
  undefined1 local_1c0 [48];
  Subject local_190 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  SubjectSetRegister local_a8 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_78 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_48 [48];
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_c0,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_c0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_d8,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_d8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_f0,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_f0,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)local_1c0,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)(local_1c0 + 0x18),(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_190,(Subject *)SS_RFQ_SUBJECT3);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1c0;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_108,__l,(allocator_type *)local_220);
  lVar6 = 0x30;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c0 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  pvVar4 = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::
  CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((internal *)local_220,"subjects_set1",
             "subject_register.NextSubscriptionSync()->GetSubjects()",&local_108,pvVar4);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1c0);
  if (local_220[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1c0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var8._M_p = "";
    }
    else {
      _Var8._M_p = *(pointer *)local_218._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x2f8,_Var8._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if ((long *)local_1c0._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_1c0._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_1c0._0_8_ + 8))();
      }
      local_1c0._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_120,(Subject *)SS_SUBJECT1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_120,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_138,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_138,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)local_a8);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)&local_150,(Subject *)SS_RFQ_SUBJECT3);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a8,&local_150,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  bidfx_public_api::price::subject::Subject::Subject((Subject *)local_220,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::subject::Subject::Subject
            ((Subject *)local_208,(Subject *)SS_RFS_SUBJECT1);
  bidfx_public_api::price::subject::Subject::Subject(local_1f0,(Subject *)SS_SUBJECT2);
  bidfx_public_api::price::subject::Subject::Subject(local_1d8,(Subject *)SS_RFQ_SUBJECT3);
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_220;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_238,__l_00,(allocator_type *)&local_248);
  lVar6 = 0x48;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cVar3 = bidfx_public_api::price::pixie::SubscriptionSync::IsChangedEdition();
  local_248.ptr_._0_1_ = (allocator_type)cVar3;
  local_240.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_220,(internal *)&local_248,
               (AssertionResult *)"message->IsChangedEdition()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x301,(char *)CONCAT71(local_220._1_7_,local_220[0]));
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_220._1_7_,local_220[0]) !=
        (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_218 + 8)) {
      operator_delete((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)CONCAT71(local_220._1_7_,local_220[0]),(ulong)(local_218._8_8_ + 1));
    }
    if (local_258.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_258.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_258.data_ + 8))();
      }
      local_258.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pvVar4 = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
  testing::internal::
  CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
            ((internal *)local_220,"subjects_set2","message->GetSubjects()",&local_238,pvVar4);
  if (local_220[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_248);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var8._M_p = "";
    }
    else {
      _Var8._M_p = *(pointer *)local_218._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x302,_Var8._M_p);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_248.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_248.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_248.ptr_ + 8))();
      }
      local_248.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  __x = (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
         *)bidfx_public_api::price::pixie::SubscriptionSync::GetControls();
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
              *)local_220,__x);
  local_258.data_ = local_258.data_ & 0xffffffff00000000;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  for (sVar1.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_218._8_8_;
      sVar1.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&(sVar1.ptr_)->field_2 + (ulong)bVar2 * 8))->ptr_) {
    bVar2 = *(int *)&sVar1.ptr_[1]._M_dataplus._M_p == 0;
    if (!bVar2) {
      pbVar5 = sVar1.ptr_;
    }
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  if ((pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218) &&
     (pbVar7 = pbVar5, 1 < *(uint *)&pbVar5[1]._M_dataplus._M_p)) {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  }
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::ControlOperationEnum,bidfx_public_api::price::pixie::ControlOperationEnum>
            ((internal *)&local_248,"ControlOperationEnum::REFRESH","controls.find(1)->second",
             (ControlOperationEnum *)&local_258,
             (ControlOperationEnum *)((long)&pbVar7[1]._M_dataplus._M_p + 4));
  if (local_248.ptr_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x305,pcVar9);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_258.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_258.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_258.data_ + 8))();
      }
      local_258.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258.data_._0_4_ = 1;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  for (; (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._8_8_ !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_218._8_8_ =
           *(undefined8 *)
            ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_218._8_8_)->field_2 + (ulong)bVar2 * 8)) {
    bVar2 = *(uint *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_218._8_8_ + 0x20))->_M_dataplus)._M_p < 3;
    if (!bVar2) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._8_8_;
    }
  }
  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  if ((pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218) &&
     (*(uint *)&pbVar5[1]._M_dataplus._M_p < 4)) {
    pbVar7 = pbVar5;
  }
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::ControlOperationEnum,bidfx_public_api::price::pixie::ControlOperationEnum>
            ((internal *)&local_248,"ControlOperationEnum::TOGGLE","controls.find(3)->second",
             (ControlOperationEnum *)&local_258,
             (ControlOperationEnum *)((long)&pbVar7[1]._M_dataplus._M_p + 4));
  if (local_248.ptr_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (local_240.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((local_240.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x306,pcVar9);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if (local_258.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_258.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_258.data_ + 8))();
      }
      local_258.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_240,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>,_std::_Select1st<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bidfx_public_api::price::pixie::ControlOperationEnum>_>_>
               *)local_220);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_238);
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1c0);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_108);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_48);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_78);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_may_combine_subscription_set_additions_with_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::vector<Subject> subjects_set1 = {SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_EQ(subjects_set1, subject_register.NextSubscriptionSync()->GetSubjects());

    subject_register.Register(SS_SUBJECT1, true); // forces refresh
    subject_register.Register(SS_SUBJECT0, false); // new addition to subscription set
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false); // forces toggle unsubscribe and subscribe

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    std::vector<Subject> subjects_set2 = {SS_SUBJECT0, SS_RFS_SUBJECT1, SS_SUBJECT2, SS_RFQ_SUBJECT3};
    EXPECT_TRUE(message->IsChangedEdition());
    EXPECT_EQ(subjects_set2, message->GetSubjects());

    auto controls = message->GetControls();
    EXPECT_EQ(ControlOperationEnum::REFRESH, controls.find(1)->second);
    EXPECT_EQ(ControlOperationEnum::TOGGLE, controls.find(3)->second);

}